

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O2

void PrintHead(sunrealtype tB0)

{
  printf("Backward integration from tB0 = %12.4e\n\n");
  return;
}

Assistant:

static void PrintHead(sunrealtype tB0)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Backward integration from tB0 = %12.4Le\n\n", tB0);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Backward integration from tB0 = %12.4e\n\n", tB0);
#else
  printf("Backward integration from tB0 = %12.4e\n\n", tB0);
#endif
}